

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

bool __thiscall
notch::core::IterationCallback::operator()
          (IterationCallback *this,int currentIteration,bool alwaysInvoke)

{
  bool alwaysInvoke_local;
  int currentIteration_local;
  IterationCallback *this_local;
  
  if ((alwaysInvoke) || ((0 < this->period && (currentIteration % this->period == 0)))) {
    this_local._7_1_ = std::function<bool_(int)>::operator()(&this->callback,currentIteration);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(int currentIteration, bool alwaysInvoke = false) const {
        if (alwaysInvoke || (period > 0 && currentIteration % period == 0)) {
            return callback(currentIteration);
        } else {
            return false;
        }
    }